

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# drvrfile.c
# Opt level: O2

int file_open(char *filename,int rwmode,int *handle)

{
  int iVar1;
  FILE *__stream;
  int iVar2;
  long lVar3;
  size_t nbytes;
  diskdriver *pdVar4;
  FILE *diskfile;
  char recbuf [2880];
  
  if (file_outfile[0] == '\0') {
    *handle = -1;
    iVar2 = 0x67;
    pdVar4 = handleTable;
    for (lVar3 = 0; lVar3 != 10000; lVar3 = lVar3 + 1) {
      if (pdVar4->fileptr == (FILE *)0x0) {
        *handle = (int)lVar3;
        iVar2 = file_openfile(filename,rwmode,&diskfile);
        goto LAB_0010ff4a;
      }
      pdVar4 = pdVar4 + 1;
    }
  }
  else {
    iVar2 = file_openfile(filename,0,&diskfile);
    if (iVar2 == 0) {
      iVar2 = file_create(file_outfile,handle);
      __stream = diskfile;
      if (iVar2 == 0) {
        do {
          nbytes = fread(recbuf,1,0xb40,(FILE *)__stream);
          if (nbytes == 0) {
            fclose((FILE *)__stream);
            iVar2 = *handle;
            file_close(iVar2);
            *handle = iVar2;
            iVar2 = file_openfile(file_outfile,rwmode,&diskfile);
            file_outfile[0] = '\0';
LAB_0010ff4a:
            iVar1 = *handle;
            handleTable[iVar1].fileptr = diskfile;
            handleTable[iVar1].currentpos = 0;
            handleTable[iVar1].last_io_op = 0;
            return iVar2;
          }
          iVar2 = file_write(*handle,recbuf,nbytes);
        } while (iVar2 == 0);
      }
      else {
        ffpmsg("Unable to create output file for copy of input file:");
        ffpmsg(file_outfile);
      }
    }
    file_outfile[0] = '\0';
  }
  return iVar2;
}

Assistant:

int file_open(char *filename, int rwmode, int *handle)
{
    FILE *diskfile;
    int copyhandle, ii, status;
    char recbuf[2880];
    size_t nread;

    /*
       if an output filename has been specified as part of the input
       file, as in "inputfile.fits(outputfile.fit)" then we have to
       create the output file, copy the input to it, then reopen the
       the new copy.
    */

    if (*file_outfile)
    {
      /* open the original file, with readonly access */
      status = file_openfile(filename, READONLY, &diskfile);
      if (status) {
        file_outfile[0] = '\0';
        return(status);
      }
      
      /* create the output file */
      status =  file_create(file_outfile,handle);
      if (status)
      {
        ffpmsg("Unable to create output file for copy of input file:");
        ffpmsg(file_outfile);
        file_outfile[0] = '\0';
        return(status);
      }

      /* copy the file from input to output */
      while(0 != (nread = fread(recbuf,1,2880, diskfile)))
      {
        status = file_write(*handle, recbuf, nread);
        if (status) {
	   file_outfile[0] = '\0';
           return(status);
        }
      }

      /* close both files */
      fclose(diskfile);
      copyhandle = *handle;
      file_close(*handle);
      *handle = copyhandle;  /* reuse the old file handle */

      /* reopen the new copy, with correct rwmode */
      status = file_openfile(file_outfile, rwmode, &diskfile);
      file_outfile[0] = '\0';
    }
    else
    {
      *handle = -1;
      for (ii = 0; ii < NMAXFILES; ii++)  /* find empty slot in table */
      {
        if (handleTable[ii].fileptr == 0)
        {
            *handle = ii;
            break;
        }
      }

      if (*handle == -1)
       return(TOO_MANY_FILES);    /* too many files opened */

      /*open the file */
      status = file_openfile(filename, rwmode, &diskfile);
    }

    handleTable[*handle].fileptr = diskfile;
    handleTable[*handle].currentpos = 0;
    handleTable[*handle].last_io_op = IO_SEEK;

    return(status);
}